

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O0

void sbfPubRemoveEventCb(int fd,short events,void *closure)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  undefined8 *in_RDX;
  sbfTportTopic ttopic;
  sbfTportStream tstream;
  sbfTport tport;
  sbfPub pub0;
  sbfTportTopic in_stack_ffffffffffffffa8;
  sbfTport tport_00;
  
  lVar1 = in_RDX[3];
  lVar2 = in_RDX[4];
  lVar3 = in_RDX[5];
  if (*(int *)((long)in_RDX + 0x14) == 0) {
    *(undefined4 *)((long)in_RDX + 0xc) = 1;
    uVar4 = *(undefined8 *)(lVar1 + 8);
    pcVar6 = sbfTopic_getTopic((sbfTopic)*in_RDX);
    sbfLog_log(uVar4,0,"not removing publisher %p (%s); not ready",in_RDX,pcVar6);
  }
  else {
    tport_00 = *(sbfTport *)(lVar1 + 8);
    pcVar6 = sbfTopic_getTopic((sbfTopic)*in_RDX);
    sbfLog_log(tport_00,0,"removing publisher %p (%s) (stream %p)",in_RDX,pcVar6,lVar2);
    if (in_RDX[0x2b] == 0) {
      *(undefined8 *)(lVar3 + 0x10) = in_RDX[0x2c];
    }
    else {
      *(undefined8 *)(in_RDX[0x2b] + 0x160) = in_RDX[0x2c];
    }
    *(undefined8 *)in_RDX[0x2c] = in_RDX[0x2b];
    if (*(long *)(lVar3 + 8) == 0) {
      iVar5 = sbfTport_removeTopic((sbfTportStream)tport_00,in_stack_ffffffffffffffa8);
      if (iVar5 != 0) {
        pthread_mutex_lock((pthread_mutex_t *)(lVar1 + 0x180));
        if (*(int *)(lVar2 + 0x18) == 0) {
          sbfTport_removeStream(tport_00,(sbfTportStream)in_stack_ffffffffffffffa8);
        }
        pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x180));
      }
    }
    iVar5 = sbfRefCount_decrement((sbfRefCount *)(in_RDX + 2));
    if (iVar5 != 0) {
      sbfPubFree((sbfPub)0x105847);
    }
  }
  return;
}

Assistant:

static void
sbfPubRemoveEventCb (int fd, short events, void* closure)
{
    sbfPub         pub0 = closure;
    sbfTport       tport = pub0->mTport;
    sbfTportStream tstream = pub0->mTportStream;
    sbfTportTopic  ttopic = pub0->mTportTopic;

    /*
     * If the pub is waiting for the stream to be added, the remove event could
     * be fired before it is ready. If so, defer the remove until the add
     * stream complete callback. The flag is set so the later callback knows
     * this callback has already fired and isn't queued behind it.
     */
    if (!pub0->mReady)
    {
        pub0->mRemoved = 1;
        sbfLog_debug (tport->mLog,
                      "not removing publisher %p (%s); not ready",
                      pub0,
                      sbfTopic_getTopic (pub0->mTopic));
        return;
    }

    sbfLog_debug (tport->mLog,
                  "removing publisher %p (%s) (stream %p)",
                  pub0,
                  sbfTopic_getTopic (pub0->mTopic),
                  tstream);

    TAILQ_REMOVE (&ttopic->mPubs, pub0, mEntry);
    if (TAILQ_EMPTY (&ttopic->mPubs) && sbfTport_removeTopic (tstream, ttopic))
    {
        sbfMutex_lock (&tport->mStreamsLock);
        /*
         * Reference count could be bumped between removeTopic (outside the
         * lock) and here.
         */
        if (sbfRefCount_get (&tstream->mRefCount) == 0)
            sbfTport_removeStream (tport, tstream);
        sbfMutex_unlock (&tport->mStreamsLock);
    }

    if (sbfRefCount_decrement (&pub0->mRefCount))
        sbfPubFree (pub0);
}